

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O3

bool vera::containsValue(vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         *_points,vec3 *_point)

{
  return false;
}

Assistant:

bool containsValue(std::vector<glm::vec3>* _points, const glm::vec3& _point) {
    for (int i = 0; i < _points->size(); i++)
        if ((_points->at(i)-_point).length()<EPS )
            return true;   
    return false;
}